

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potpourri.cpp
# Opt level: O1

ostream * operator<<(ostream *os,Vec<float,_3UL> *v)

{
  code *pcVar1;
  ostream *poVar2;
  ostream *poVar3;
  long lVar4;
  int i;
  long lVar5;
  char cStack_61;
  ostream *poStack_60;
  undefined8 uStack_58;
  long lStack_50;
  Vec<float,_3UL> *pVStack_48;
  code *pcStack_40;
  char local_29;
  
  local_29 = '[';
  pcStack_40 = (code *)0x1022a3;
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_29,1);
  lVar5 = 0;
  do {
    pcStack_40 = (code *)0x1022bf;
    poVar2 = std::ostream::_M_insert<double>((double)v->data[lVar5]);
    pcStack_40 = (code *)0x1022cd;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  pcStack_40 = (code *)0x1022e4;
  poVar2 = (ostream *)std::ostream::operator<<(os,v->data[2]);
  lVar4 = 0x5d;
  pcStack_40 = operator<<;
  std::operator<<(poVar2,']');
  pcStack_40 = (code *)0x105098;
  uStack_58 = 2;
  cStack_61 = '[';
  poStack_60 = os;
  lStack_50 = lVar5;
  pVStack_48 = v;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&cStack_61,1);
  lVar5 = 0;
  do {
    poVar3 = std::ostream::_M_insert<double>((double)*(float *)(lVar4 + lVar5 * 4));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)(lVar4 + 0xc));
  std::operator<<(poVar2,']');
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Vec<T, N>& v) {
        os << '[';

        for (int i = 0; i < N - 1; i++) {
            os << v.data[i] << ", ";
        }

        os << v.data[N - 1] << ']';
    }